

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::ne(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  Literal *other_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x5c0);
  case i32:
    Literal(__return_storage_ptr__,(uint)((this->field_0).i32 != (other->field_0).i32));
    break;
  case i64:
    Literal(__return_storage_ptr__,(uint)((this->field_0).i64 != (other->field_0).i64));
    break;
  case f32:
    fVar2 = getf32(this);
    fVar3 = getf32(other);
    Literal(__return_storage_ptr__,(uint)(fVar2 != fVar3));
    break;
  case f64:
    dVar4 = getf64(this);
    dVar5 = getf64(other);
    Literal(__return_storage_ptr__,(uint)(dVar4 != dVar5));
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x5c2);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ne(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 != other.i32);
    case Type::i64:
      return Literal(i64 != other.i64);
    case Type::f32:
      return Literal(getf32() != other.getf32());
    case Type::f64:
      return Literal(getf64() != other.getf64());
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}